

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O0

ValueType *
rapidjson::internal::
Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
::GetValidateErrorKeyword(ValidateErrorCode validateErrorCode)

{
  ValueType *pVStack_10;
  ValidateErrorCode validateErrorCode_local;
  
  switch(validateErrorCode) {
  case kValidateErrorMultipleOf:
    pVStack_10 = GetMultipleOfString();
    break;
  case kValidateErrorMaximum:
    pVStack_10 = GetMaximumString();
    break;
  case kValidateErrorExclusiveMaximum:
    pVStack_10 = GetMaximumString();
    break;
  case kValidateErrorMinimum:
    pVStack_10 = GetMinimumString();
    break;
  case kValidateErrorExclusiveMinimum:
    pVStack_10 = GetMinimumString();
    break;
  case kValidateErrorMaxLength:
    pVStack_10 = GetMaxLengthString();
    break;
  case kValidateErrorMinLength:
    pVStack_10 = GetMinLengthString();
    break;
  case kValidateErrorPattern:
    pVStack_10 = GetPatternString();
    break;
  case kValidateErrorMaxItems:
    pVStack_10 = GetMaxItemsString();
    break;
  case kValidateErrorMinItems:
    pVStack_10 = GetMinItemsString();
    break;
  case kValidateErrorUniqueItems:
    pVStack_10 = GetUniqueItemsString();
    break;
  case kValidateErrorAdditionalItems:
    pVStack_10 = GetAdditionalItemsString();
    break;
  case kValidateErrorMaxProperties:
    pVStack_10 = GetMaxPropertiesString();
    break;
  case kValidateErrorMinProperties:
    pVStack_10 = GetMinPropertiesString();
    break;
  case kValidateErrorRequired:
    pVStack_10 = GetRequiredString();
    break;
  case kValidateErrorAdditionalProperties:
    pVStack_10 = GetAdditionalPropertiesString();
    break;
  case kValidateErrorPatternProperties:
    pVStack_10 = GetPatternPropertiesString();
    break;
  case kValidateErrorDependencies:
    pVStack_10 = GetDependenciesString();
    break;
  case kValidateErrorEnum:
    pVStack_10 = GetEnumString();
    break;
  case kValidateErrorType:
    pVStack_10 = GetTypeString();
    break;
  case kValidateErrorOneOf:
    pVStack_10 = GetOneOfString();
    break;
  case kValidateErrorOneOfMatch:
    pVStack_10 = GetOneOfString();
    break;
  case kValidateErrorAllOf:
    pVStack_10 = GetAllOfString();
    break;
  case kValidateErrorAnyOf:
    pVStack_10 = GetAnyOfString();
    break;
  case kValidateErrorNot:
    pVStack_10 = GetNotString();
    break;
  case kValidateErrorReadOnly:
    pVStack_10 = GetReadOnlyString();
    break;
  case kValidateErrorWriteOnly:
    pVStack_10 = GetWriteOnlyString();
    break;
  default:
    pVStack_10 = GetNullString();
  }
  return pVStack_10;
}

Assistant:

static const ValueType& GetValidateErrorKeyword(ValidateErrorCode validateErrorCode) {
        switch (validateErrorCode) {
            case kValidateErrorMultipleOf:              return GetMultipleOfString();
            case kValidateErrorMaximum:                 return GetMaximumString();
            case kValidateErrorExclusiveMaximum:        return GetMaximumString(); // Same
            case kValidateErrorMinimum:                 return GetMinimumString();
            case kValidateErrorExclusiveMinimum:        return GetMinimumString(); // Same

            case kValidateErrorMaxLength:               return GetMaxLengthString();
            case kValidateErrorMinLength:               return GetMinLengthString();
            case kValidateErrorPattern:                 return GetPatternString();

            case kValidateErrorMaxItems:                return GetMaxItemsString();
            case kValidateErrorMinItems:                return GetMinItemsString();
            case kValidateErrorUniqueItems:             return GetUniqueItemsString();
            case kValidateErrorAdditionalItems:         return GetAdditionalItemsString();

            case kValidateErrorMaxProperties:           return GetMaxPropertiesString();
            case kValidateErrorMinProperties:           return GetMinPropertiesString();
            case kValidateErrorRequired:                return GetRequiredString();
            case kValidateErrorAdditionalProperties:    return GetAdditionalPropertiesString();
            case kValidateErrorPatternProperties:       return GetPatternPropertiesString();
            case kValidateErrorDependencies:            return GetDependenciesString();

            case kValidateErrorEnum:                    return GetEnumString();
            case kValidateErrorType:                    return GetTypeString();

            case kValidateErrorOneOf:                   return GetOneOfString();
            case kValidateErrorOneOfMatch:              return GetOneOfString(); // Same
            case kValidateErrorAllOf:                   return GetAllOfString();
            case kValidateErrorAnyOf:                   return GetAnyOfString();
            case kValidateErrorNot:                     return GetNotString();

            case kValidateErrorReadOnly:                return GetReadOnlyString();
            case kValidateErrorWriteOnly:               return GetWriteOnlyString();

            default:                                    return GetNullString();
        }
    }